

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnFunction
          (BinaryReaderInterp *this,Index index,Index sig_index)

{
  ModuleDesc *pMVar1;
  bool bVar2;
  value_type local_f8;
  reference local_98;
  FuncType *func_type;
  Var local_70;
  Enum local_24;
  Index local_20;
  Index local_1c;
  Index sig_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_20 = sig_index;
  local_1c = index;
  _sig_index_local = this;
  Location::Location((Location *)&func_type);
  Var::Var(&local_70,sig_index,(Location *)&func_type);
  local_24 = (Enum)SharedValidator::OnFunction
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_70);
  bVar2 = Failed((Result)local_24);
  Var::~Var(&local_70);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    local_98 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->module_->func_types,(ulong)local_20);
    pMVar1 = this->module_;
    FuncType::FuncType(&local_f8.type,local_98);
    memset(&local_f8.locals,0,0x18);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              (&local_f8.locals);
    local_f8.code_offset = 0;
    std::vector<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>::push_back
              (&pMVar1->funcs,&local_f8);
    FuncDesc::~FuncDesc(&local_f8);
    std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::push_back
              (&this->func_types_,local_98);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnFunction(Index index, Index sig_index) {
  CHECK_RESULT(validator_.OnFunction(loc, Var(sig_index)));
  FuncType& func_type = module_.func_types[sig_index];
  module_.funcs.push_back(FuncDesc{func_type, {}, 0});
  func_types_.push_back(func_type);
  return Result::Ok;
}